

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O0

int vfio_disable_msi(int device_fd)

{
  int iVar1;
  int *piVar2;
  int in_EDI;
  char buf [512];
  int err;
  int64_t result;
  vfio_irq_set *irq_set;
  char irq_set_buf [24];
  undefined1 local_248 [524];
  int local_3c;
  long local_38;
  undefined4 *local_30;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  int local_4;
  
  local_4 = in_EDI;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSI Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x4b,
          "vfio_disable_msi");
  local_30 = &local_28;
  local_28 = 0x18;
  local_18 = 0;
  local_24 = 0x21;
  local_20 = 1;
  local_1c = 0;
  iVar1 = ioctl(local_4,0x3b6e,local_30);
  local_38 = (long)iVar1;
  if (local_38 == -1) {
    piVar2 = __errno_location();
    local_3c = *piVar2;
    __xpg_strerror_r(local_3c,local_248,0x200);
    fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",
            0x55,"vfio_disable_msi","disable MSI interrupts",local_248);
    exit(local_3c);
  }
  return 0;
}

Assistant:

int vfio_disable_msi(int device_fd) {
	info("Disable MSI Interrupts");
	char irq_set_buf[IRQ_SET_BUF_LEN];

	struct vfio_irq_set* irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(irq_set_buf);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSI_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSI interrupts");

	return 0;
}